

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

int32_t sysbvm_integer_subtractFromInto
                  (size_t leftWordCount,uint32_t *leftWords,size_t rightWordCount,
                  uint32_t *rightWords,size_t resultWordCount,uint32_t *resultWords)

{
  size_t i;
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar1 = rightWordCount;
  if (rightWordCount < leftWordCount) {
    sVar1 = leftWordCount;
  }
  if (sVar1 != 0) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      if (uVar3 < leftWordCount) {
        uVar5 = (ulong)leftWords[uVar3];
      }
      else {
        uVar5 = 0;
      }
      if (uVar3 < rightWordCount) {
        uVar6 = (ulong)rightWords[uVar3];
      }
      else {
        uVar6 = 0;
      }
      uVar4 = ((long)uVar4 >> 0x20) + (uVar5 - uVar6);
      if (uVar3 < resultWordCount) {
        resultWords[uVar3] = (uint32_t)uVar4;
      }
      uVar4 = uVar4 & 0xffffffff00000000;
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  if (sVar1 <= resultWordCount && resultWordCount - sVar1 != 0) {
    pvVar2 = memset(resultWords + sVar1,0,(resultWordCount - sVar1) * 4);
    return (int32_t)pvVar2;
  }
  return (int32_t)sVar1;
}

Assistant:

static int32_t sysbvm_integer_subtractFromInto(size_t leftWordCount, uint32_t *leftWords, size_t rightWordCount, uint32_t *rightWords, size_t resultWordCount, uint32_t *resultWords)
{
    int32_t borrow = 0;
    
    size_t wordsToSum = leftWordCount > rightWordCount ? leftWordCount : rightWordCount;
    for(size_t i = 0; i < wordsToSum; ++i)
    {
        uint32_t leftWord = i < leftWordCount ? leftWords[i] : 0;
        uint32_t rightWord = i < rightWordCount ? rightWords[i] : 0;

        int64_t subtraction = (int64_t)leftWord - (int64_t)rightWord + (int64_t)borrow;
        uint32_t subtractionWord = (uint32_t)subtraction;
        if(i < resultWordCount)
            resultWords[i] = subtractionWord;

        borrow = (int32_t)(subtraction >> 32);
    }

    for(size_t i = wordsToSum; i < resultWordCount; ++i)
    {
        if(i < resultWordCount)
            resultWords[i] = 0;
    }

    return borrow;
}